

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O3

int __thiscall cmGraphVizWriter::CollectAllTargets(cmGraphVizWriter *this)

{
  pointer ppcVar1;
  pointer ppcVar2;
  cmGeneratorTarget *this_00;
  bool bVar3;
  string *name;
  ostream *this_01;
  mapped_type *this_02;
  mapped_type *ppcVar4;
  pointer ppcVar5;
  int iVar6;
  pointer ppcVar7;
  ostringstream ostr;
  long *local_1c8 [2];
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  ppcVar5 = (this->LocalGenerators->
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar1 = (this->LocalGenerators->
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppcVar5 == ppcVar1) {
    iVar6 = 0;
  }
  else {
    iVar6 = 0;
    do {
      ppcVar2 = ((*ppcVar5)->GeneratorTargets).
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar7 = ((*ppcVar5)->GeneratorTargets).
                     super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppcVar7 != ppcVar2;
          ppcVar7 = ppcVar7 + 1) {
        this_00 = *ppcVar7;
        name = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
        bVar3 = IgnoreThisTarget(this,name);
        if (!bVar3) {
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          this_01 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(this->GraphNodePrefix)._M_dataplus._M_p,
                               (this->GraphNodePrefix)._M_string_length);
          std::ostream::operator<<(this_01,iVar6);
          std::__cxx11::stringbuf::str();
          this_02 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&this->TargetNamesNodes,name);
          std::__cxx11::string::operator=((string *)this_02,(string *)local_1c8);
          if (local_1c8[0] != local_1b8) {
            operator_delete(local_1c8[0],local_1b8[0] + 1);
          }
          ppcVar4 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorTarget_*>_>_>
                    ::operator[](&this->TargetPtrs,name);
          iVar6 = iVar6 + 1;
          *ppcVar4 = this_00;
          std::__cxx11::ostringstream::~ostringstream(local_1a8);
          std::ios_base::~ios_base(local_138);
        }
      }
      ppcVar5 = ppcVar5 + 1;
    } while (ppcVar5 != ppcVar1);
  }
  return iVar6;
}

Assistant:

int cmGraphVizWriter::CollectAllTargets()
{
  int cnt = 0;
  // First pass get the list of all cmake targets
  for (cmLocalGenerator* lg : this->LocalGenerators) {
    const std::vector<cmGeneratorTarget*>& targets = lg->GetGeneratorTargets();
    for (cmGeneratorTarget* target : targets) {
      const std::string& realTargetName = target->GetName();
      if (this->IgnoreThisTarget(realTargetName)) {
        // Skip ignored targets
        continue;
      }
      // std::cout << "Found target: " << tit->first << std::endl;
      std::ostringstream ostr;
      ostr << this->GraphNodePrefix << cnt++;
      this->TargetNamesNodes[realTargetName] = ostr.str();
      this->TargetPtrs[realTargetName] = target;
    }
  }

  return cnt;
}